

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManFixPoDrivers(Nf_Man_t *p)

{
  Nf_Cfg_t NVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj_00;
  Nf_Mat_t *pM_00;
  Nf_Mat_t *pNVar5;
  bool bVar6;
  int Count;
  int iDriver;
  int i;
  Nf_Mat_t *pMc;
  Nf_Mat_t *pM;
  Gia_Obj_t *pObj;
  Nf_Man_t *p_local;
  
  Count = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->pGia->vCos);
    bVar6 = false;
    if (Count < iVar3) {
      pM = (Nf_Mat_t *)Gia_ManCo(p->pGia,Count);
      bVar6 = pM != (Nf_Mat_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjFaninId0p(p->pGia,(Gia_Obj_t *)pM);
    pObj_00 = Gia_ManObj(p->pGia,iVar3);
    iVar4 = Gia_ObjIsAnd(pObj_00);
    if (((iVar4 != 0) && (iVar4 = Nf_ObjMapRefNum(p,iVar3,0), iVar4 != 0)) &&
       (iVar4 = Nf_ObjMapRefNum(p,iVar3,1), iVar4 != 0)) {
      iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pM);
      pM_00 = Nf_ObjMatchD(p,iVar3,iVar4);
      iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pM);
      pNVar5 = Nf_ObjMatchD(p,iVar3,(uint)((iVar4 != 0 ^ 0xffU) & 1));
      if ((((*(uint *)pM_00 >> 0x1e & 1) == 0) && ((*(uint *)pNVar5 >> 0x1e & 1) == 0)) &&
         (pNVar5->D + p->InvDelayI <= p->pPars->MapDelay)) {
        iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pM);
        Nf_MatchDeref_rec(p,iVar3,iVar4,pM_00);
        iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pM);
        Nf_ObjMapRefInc(p,iVar3,(uint)((iVar4 != 0 ^ 0xffU) & 1));
        NVar1 = pNVar5->Cfg;
        *(undefined4 *)&pM_00->field_0x0 = *(undefined4 *)&pNVar5->field_0x0;
        pM_00->Cfg = NVar1;
        fVar2 = pNVar5->F;
        pM_00->D = pNVar5->D;
        pM_00->F = fVar2;
        pM_00->D = p->InvDelayI + pM_00->D;
        *(uint *)pM_00 = *(uint *)pM_00 & 0xbfffffff | 0x40000000;
        *(uint *)pM_00 = *(uint *)pM_00 & 0x7fffffff | 0x80000000;
        *(uint *)pNVar5 = *(uint *)pNVar5 & 0x7fffffff | 0x80000000;
      }
    }
    Count = Count + 1;
  }
  return;
}

Assistant:

void Nf_ManFixPoDrivers( Nf_Man_t * p )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pM, * pMc;
    int i, iDriver, Count = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iDriver = Gia_ObjFaninId0p(p->pGia, pObj);
        if ( !Gia_ObjIsAnd(Gia_ManObj(p->pGia, iDriver)) )
            continue;
        // skip unless both are used
        if ( !Nf_ObjMapRefNum(p, iDriver, 0) || !Nf_ObjMapRefNum(p, iDriver, 1) )
            continue;
        pM  = Nf_ObjMatchD( p, iDriver,  Gia_ObjFaninC0(pObj) );
        pMc = Nf_ObjMatchD( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // skip unless both are non-complemented
        if ( pM->fCompl || pMc->fCompl )
            continue;
        // skip if arrival time exceeds the required time
        if ( pMc->D + p->InvDelayI > p->pPars->MapDelay )
            continue;
        // update references
        Nf_MatchDeref_rec( p, iDriver, Gia_ObjFaninC0(pObj), pM );
        Nf_ObjMapRefInc( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // add inverter
        *pM = *pMc;
        pM->D += p->InvDelayI;
        pM->fCompl = 1;
        pM->fBest = 1;
        pMc->fBest = 1;
        Count++;
    }
    //printf( "Fixed %d PO drivers.\n", Count );
}